

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTypeDefinition.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XSTypeDefinition::derivedFrom(XSTypeDefinition *this,XMLCh *typeNamespace,XMLCh *name)

{
  int iVar1;
  XSTypeDefinition *pXVar2;
  XSTypeDefinition *type;
  XMLCh *name_local;
  XMLCh *typeNamespace_local;
  XSTypeDefinition *this_local;
  
  if (name == (XMLCh *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pXVar2 = XSModel::getTypeDefinition((this->super_XSObject).fXSModel,name,typeNamespace);
    if (pXVar2 == (XSTypeDefinition *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = (*(this->super_XSObject)._vptr_XSObject[8])(this,pXVar2);
      this_local._7_1_ = (bool)((byte)iVar1 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool XSTypeDefinition::derivedFrom(const XMLCh *typeNamespace, 
                                   const XMLCh *name)
{    
    if (!name)
        return false;

    XSTypeDefinition* type = fXSModel->getTypeDefinition(name, typeNamespace);
    
    if (!type)
        return false;

    return derivedFromType(type);
}